

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeT2LoadLabel(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t RegNo;
  uint32_t uVar2;
  uint uVar3;
  DecodeStatus In;
  uint32_t local_40;
  int imm;
  uint U;
  uint Rt;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Insn_local;
  MCInst *Inst_local;
  
  U = 3;
  _Rt = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Insn;
  pMStack_18 = Inst;
  RegNo = fieldFromInstruction_4(Insn,0xc,4);
  uVar2 = fieldFromInstruction_4(Address_local._4_4_,0x17,1);
  local_40 = fieldFromInstruction_4(Address_local._4_4_,0,0xc);
  if (RegNo == 0xf) {
    uVar3 = MCInst_getOpcode(pMStack_18);
    switch(uVar3) {
    case 0x947:
    case 0x956:
      MCInst_setOpcode(pMStack_18,0x9af);
      break;
    default:
      break;
    case 0x95e:
      MCInst_setOpcode(pMStack_18,0x9b3);
      break;
    case 0x966:
      return MCDisassembler_Fail;
    }
  }
  uVar3 = MCInst_getOpcode(pMStack_18);
  if ((uVar3 != 0x9af) && (uVar3 != 0x9b3)) {
    In = DecodeGPRRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_Rt);
    _Var1 = Check(&U,In);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  if (uVar2 == 0) {
    if (local_40 == 0) {
      local_40 = 0x80000000;
    }
    else {
      local_40 = -local_40;
    }
  }
  MCOperand_CreateImm0(pMStack_18,(long)(int)local_40);
  return U;
}

Assistant:

static DecodeStatus DecodeT2LoadLabel(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void* Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned U = fieldFromInstruction_4(Insn, 23, 1);
	int imm = fieldFromInstruction_4(Insn, 0, 12);

	if (Rt == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRBpci:
			case ARM_t2LDRHpci:
				MCInst_setOpcode(Inst, ARM_t2PLDpci);
				break;
			case ARM_t2LDRSBpci:
				MCInst_setOpcode(Inst, ARM_t2PLIpci);
				break;
			case ARM_t2LDRSHpci:
				return MCDisassembler_Fail;
			default:
				break;
		}
	}

	switch(MCInst_getOpcode(Inst)) {
		case ARM_t2PLDpci:
		case ARM_t2PLIpci:
			break;
		default:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
				return MCDisassembler_Fail;
	}

	if (!U) {
		// Special case for #-0.
		if (imm == 0)
			imm = INT32_MIN;
		else
			imm = -imm;
	}
	MCOperand_CreateImm0(Inst, imm);

	return S;
}